

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O2

void __thiscall so_5::agent_t::do_state_switch(agent_t *this,state_t *state_to_be_set)

{
  ulong uVar1;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  path_t new_path;
  path_t old_path;
  path_t local_120;
  path_t local_a0;
  
  state_t::fill_path(this->m_current_state_ptr,&local_a0);
  state_t::fill_path(state_to_be_set,&local_120);
  uVar3 = this->m_current_state_ptr->m_nested_level;
  if (state_to_be_set->m_nested_level < uVar3) {
    uVar3 = state_to_be_set->m_nested_level;
  }
  for (uVar1 = 0;
      (uVar4 = uVar3, uVar3 != uVar1 &&
      (uVar4 = uVar1, local_a0._M_elems[uVar1] == local_120._M_elems[uVar1])); uVar1 = uVar1 + 1) {
  }
  impl::msg_tracing_helpers::safe_trace_state_leaving(this,this->m_current_state_ptr);
  sVar2 = this->m_current_state_ptr->m_nested_level;
  do {
    if (sVar2 < uVar4) break;
    state_t::call_on_exit(local_a0._M_elems[sVar2]);
    bVar5 = sVar2 != 0;
    sVar2 = sVar2 - 1;
  } while (bVar5);
  impl::msg_tracing_helpers::safe_trace_state_entering(this,state_to_be_set);
  for (; uVar4 <= state_to_be_set->m_nested_level; uVar4 = uVar4 + 1) {
    state_t::call_on_enter(local_120._M_elems[uVar4]);
  }
  this->m_current_state_ptr = state_to_be_set;
  state_t::update_history_in_parent_states(state_to_be_set);
  return;
}

Assistant:

void
agent_t::do_state_switch(
	const state_t & state_to_be_set )
{
	state_t::path_t old_path;
	state_t::path_t new_path;

	m_current_state_ptr->fill_path( old_path );
	state_to_be_set.fill_path( new_path );

	// Find the first item which is different in the paths.
	std::size_t first_diff = 0;
	for(; first_diff < std::min(
				m_current_state_ptr->nested_level(),
				state_to_be_set.nested_level() );
			++first_diff )
		if( old_path[ first_diff ] != new_path[ first_diff ] )
			break;

	// Do call for on_exit and on_enter for states.
	// on_exit and on_enter should not throw exceptions.
	so_5::details::invoke_noexcept_code( [&] {

		impl::msg_tracing_helpers::safe_trace_state_leaving(
				*this, *m_current_state_ptr );
		for( std::size_t i = m_current_state_ptr->nested_level();
				i >= first_diff; )
			{
				old_path[ i ]->call_on_exit();
				if( i )
					--i;
				else
					break;
			}

		impl::msg_tracing_helpers::safe_trace_state_entering(
				*this, state_to_be_set );
		for( std::size_t i = first_diff;
				i <= state_to_be_set.nested_level();
				++i )
			{
				new_path[ i ]->call_on_enter();
			}
	} );

	// Now the current state for the agent can be changed.
	m_current_state_ptr = &state_to_be_set;
	m_current_state_ptr->update_history_in_parent_states();
}